

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

Bridges * __thiscall
Graph::random_bridges_search(Bridges *__return_storage_ptr__,Graph *this,bool recursive)

{
  bool bVar1;
  reference __args;
  Edge *e;
  iterator __end1;
  iterator __begin1;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> *__range1;
  bool recursive_local;
  Graph *this_local;
  
  clear(this);
  if (recursive) {
    dfsForRandomRecursive(this,0);
  }
  else {
    dfsForRandomIterative(this);
  }
  __end1 = std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::begin(&this->edges);
  e = (Edge *)std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::end(&this->edges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
                                *)&e);
    if (!bVar1) break;
    __args = __gnu_cxx::
             __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>
             ::operator*(&__end1);
    if (__args->shift == 0) {
      std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
      emplace_back<unsigned_long&,unsigned_long&>
                ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&this->bridges,
                 (unsigned_long *)__args,&(__args->super_LightEdge).v);
    }
    __gnu_cxx::
    __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_>::
    operator++(&__end1);
  }
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector
            (__return_storage_ptr__,&this->bridges);
  return __return_storage_ptr__;
}

Assistant:

Graph::Bridges Graph::random_bridges_search(bool recursive) {
    clear();
    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    for (auto &e : edges)
        if (e.shift == 0)
            bridges.emplace_back(e.u, e.v);

    return bridges;
}